

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_cv_posix.cpp
# Opt level: O2

ssize_t pstore::descriptor_condition_variable::write(int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ssize_t sVar2;
  uint *puVar3;
  pipe_content_type buffer;
  
  buffer = '\0';
  do {
    sVar2 = ::write(__fd,&buffer,1);
    if (-1 < sVar2) {
      return 0;
    }
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
  } while ((uVar1 == 4) || (uVar1 == 0xb));
  return (ulong)uVar1;
}

Assistant:

int descriptor_condition_variable::write (int const fd) noexcept {
        pipe_content_type const buffer{};
        for (;;) {
            if (::write (fd, &buffer, sizeof (buffer)) < 0) {
                if (errno != EINTR && errno != EAGAIN) {
                    return errno;
                }
                // Retry the write.
            } else {
                // Success.
                break;
            }
        }
        return 0;
    }